

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_solid.cc
# Opt level: O0

bool __thiscall hwtest::pgraph::MthdSolidFormat::is_valid_val(MthdSolidFormat *this)

{
  uint uVar1;
  bool bVar2;
  bool local_29;
  bool local_21;
  MthdSolidFormat *this_local;
  
  if (((this->super_SingleMthdTest).super_MthdTest.cls & 0xff00) == 0) {
    bVar2 = true;
    if ((this->is_new & 1U) == 0) {
      bVar2 = (this->super_SingleMthdTest).super_MthdTest.cls == 0x4b;
    }
    uVar1 = 5;
    if (bVar2) {
      uVar1 = 4;
    }
    local_29 = false;
    if ((this->super_SingleMthdTest).super_MthdTest.val < uVar1) {
      local_29 = (this->super_SingleMthdTest).super_MthdTest.val != 0;
    }
    this_local._7_1_ = local_29;
  }
  else {
    local_21 = false;
    if ((this->super_SingleMthdTest).super_MthdTest.val < 5) {
      local_21 = (this->super_SingleMthdTest).super_MthdTest.val != 0;
    }
    this_local._7_1_ = local_21;
  }
  return this_local._7_1_;
}

Assistant:

bool is_valid_val() override {
		if (cls & 0xff00)
			return val < 5 && val != 0;
		return val < (is_new || cls == 0x4b ? 4 : 5) && val != 0;
	}